

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::ParseDisambiguator
          (RustSymbolParser *this,int *value)

{
  bool bVar1;
  int iVar2;
  int base_62_value;
  
  *value = -1;
  if (this->encoding_[this->pos_] == 's') {
    this->pos_ = this->pos_ + 1;
    base_62_value = 0;
    bVar1 = ParseBase62Number(this,&base_62_value);
    if (bVar1) {
      iVar2 = -1;
      if (-1 < base_62_value) {
        iVar2 = base_62_value + 1;
      }
      *value = iVar2;
    }
  }
  else {
    *value = 0;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseDisambiguator(int& value) {
    value = -1;

    // disambiguator = s base-62-number
    //
    // Disambiguators are optional.  An omitted disambiguator is zero.
    if (!Eat('s')) {
      value = 0;
      return true;
    }
    int base_62_value = 0;
    if (!ParseBase62Number(base_62_value)) return false;
    value = base_62_value < 0 ? -1 : base_62_value + 1;
    return true;
  }